

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

Vec_Int_t * Kf_ManCreateFaninCounts(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar5 = p->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar2 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  iVar6 = 0;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar3;
  if (0 < iVar5) {
    pGVar4 = p->pObjs;
    if (pGVar4 != (Gia_Obj_t *)0x0) {
      lVar7 = 0;
      do {
        uVar1 = *(ulong *)pGVar4;
        iVar5 = 0;
        if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
          iVar5 = 2 - ((uint)(((undefined1  [12])
                               pGVar4[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)] &
                              (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) +
                      (uint)(((undefined1  [12])pGVar4[-(uVar1 & 0x1fffffff)] &
                             (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff));
        }
        Vec_IntPush(p_00,iVar5);
        lVar7 = lVar7 + 1;
        iVar5 = p->nObjs;
      } while ((lVar7 < iVar5) && (pGVar4 = p->pObjs + lVar7, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar6 = p_00->nSize;
  }
  if (iVar6 == iVar5) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vCounts) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0x3ea,"Vec_Int_t *Kf_ManCreateFaninCounts(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Kf_ManCreateFaninCounts( Gia_Man_t * p )  
{
    Vec_Int_t * vCounts;
    Gia_Obj_t * pObj; int i;
    vCounts = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( vCounts, 2 - Gia_ObjIsCi(Gia_ObjFanin0(pObj)) - Gia_ObjIsCi(Gia_ObjFanin1(pObj)) );
        else
            Vec_IntPush( vCounts, 0 );
    }
    assert( Vec_IntSize(vCounts) == Gia_ManObjNum(p) );
    return vCounts;
}